

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::TypeResolver::visit(TypeResolver *this,TypeMetaFunction *c)

{
  Context *c_00;
  size_t *psVar1;
  Allocator *pAVar2;
  DestructorFn *pDVar3;
  bool bVar4;
  int iVar5;
  ConcreteType *pCVar6;
  Constant *pCVar7;
  PoolItem *pPVar8;
  Identifier i;
  QualifiedIdentifier *nameOrTargetType;
  PoolItem *pPVar9;
  string_view newString;
  undefined1 local_b8 [88];
  CompileMessage local_60;
  
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&c->source);
  if (((c->super_Expression).kind == type) &&
     (iVar5 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c),
     (char)iVar5 != '\0')) {
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[5])(local_b8,c);
    pCVar6 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type>
                       (&pAVar2->pool,&(c->super_Expression).super_Statement.super_ASTObject.context
                        ,(Type *)local_b8);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_b8._16_8_);
    return &pCVar6->super_Expression;
  }
  if (((c->super_Expression).kind == value) &&
     (iVar5 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c),
     (char)iVar5 != '\0')) {
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    AST::TypeMetaFunction::getResultValue((Value *)local_b8,c);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar2->pool,&(c->super_Expression).super_Statement.super_ASTObject.context
                        ,(Value *)local_b8);
    soul::Value::~Value((Value *)local_b8);
    return &pCVar7->super_Expression;
  }
  bVar4 = AST::TypeMetaFunction::isSizeOfUnsizedType(c);
  if (bVar4) {
    c_00 = &(c->super_Expression).super_Statement.super_ASTObject.context;
    pPVar8 = PoolAllocator::allocateSpaceForObject
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,0x68);
    AST::CommaSeparatedList::CommaSeparatedList((CommaSeparatedList *)&pPVar8->item,c_00);
    pPVar8->destructor =
         PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
         anon_class_1_0_00000001::__invoke;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar8 + 2),
               (size_t)(pPVar8[2].destructor + 1));
    pDVar3 = pPVar8[2].destructor;
    *(Expression **)(pPVar8[2].size + (long)pDVar3 * 8) = (c->source).object;
    pPVar8[2].destructor = pDVar3 + 1;
    newString._M_str = "get_array_size";
    newString._M_len = 0xe;
    i = Identifier::Pool::get
                  (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->identifiers,
                   newString);
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    IdentifierPath::IdentifierPath((IdentifierPath *)local_b8,i);
    nameOrTargetType =
         PoolAllocator::
         allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                   (&pAVar2->pool,c_00,(IdentifierPath *)local_b8);
    local_b8._8_8_ = 0;
    if ((Structure *)0x8 < (ulong)local_b8._16_8_) {
      if ((CommaSeparatedList *)local_b8._0_8_ != (CommaSeparatedList *)0x0) {
        operator_delete__((void *)local_b8._0_8_);
      }
      local_b8._0_8_ = local_b8 + 0x18;
      local_b8._16_8_ = (Structure *)0x8;
    }
    pPVar9 = PoolAllocator::allocateSpaceForObject
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,0x48);
    c = (TypeMetaFunction *)&pPVar9->item;
    local_b8._0_8_ = &pPVar8->item;
    AST::CallOrCast::CallOrCast
              ((CallOrCast *)c,&nameOrTargetType->super_Expression,
               (pool_ptr<soul::AST::CommaSeparatedList> *)local_b8,true);
    pPVar9->destructor =
         PoolAllocator::
         allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::AST::CommaSeparatedList_&,_bool>
         ::anon_class_1_0_00000001::__invoke;
  }
  else {
    if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors != true) {
      AST::TypeMetaFunction::throwErrorIfUnresolved(c);
      CompileMessageHelpers::createMessage<>(&local_60,syntax,error,"Cannot resolve source type");
      AST::Context::throwError
                (&(c->super_Expression).super_Statement.super_ASTObject.context,&local_60,false);
    }
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  return &c->super_Expression;
}

Assistant:

AST::Expression& visit (AST::TypeMetaFunction& c) override
        {
            super::visit (c);

            if (AST::isResolvedAsType (c))
                return allocator.allocate<AST::ConcreteType> (c.context, c.resolveAsType());

            if (AST::isResolvedAsValue (c))
                return allocator.allocate<AST::Constant> (c.context, c.getResultValue());

            if (c.isSizeOfUnsizedType())
            {
                auto& argList = allocator.allocate<AST::CommaSeparatedList> (c.context);
                argList.items.push_back (c.source);

                auto name = allocator.identifiers.get ("get_array_size");
                auto& qi = allocator.allocate<AST::QualifiedIdentifier> (c.context, IdentifierPath (name));
                return allocator.allocate<AST::CallOrCast> (qi, argList, true);
            }

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                c.throwErrorIfUnresolved();
                c.context.throwError (Errors::cannotResolveSourceType());
            }

            return c;
        }